

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textdefs.c
# Opt level: O0

void str_int_impl(uchar **s,uint64_t x)

{
  uchar *puVar1;
  uint64_t t;
  int shift;
  int8_t *buf;
  uint64_t x_local;
  uchar **s_local;
  
  shift = 0;
  puVar1 = *s;
  *puVar1 = '0';
  buf = (int8_t *)(puVar1 + 2);
  puVar1[1] = 'x';
  t = x;
  if (x == 0) {
    *buf = '0';
    *s = *s + 3;
  }
  else {
    do {
      t = t >> 4;
      shift = shift + 4;
    } while (t != 0);
    do {
      shift = shift + -4;
      puVar1 = (uchar *)(buf + 1);
      *buf = Nibble2ChrTable[x >> ((byte)shift & 0x3f) & 0xf];
      buf = (int8_t *)puVar1;
    } while (0 < shift);
    *s = puVar1;
  }
  return;
}

Assistant:

void str_int_impl(unsigned char** s, uint64_t x)
{
	int8_t* buf;
	int shift = 0;
	OFFSET_INTEGER t = x;

	buf = (int8_t*)*s;

	*buf++ = '0';
	*buf++ = 'x';

	if (x == 0) {
		*buf = '0';
		*s += 3;
		return;
	}

	do {
		t >>= 4;
		shift += 4;
	} while (t);

	do {
		shift -= 4;
		t = (x >> shift) & 0xf;
		*buf++ = NIBBLE_TO_CHR;
	} while (shift > 0);

	*s = (unsigned char*)buf;
}